

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O1

void opj_pi_create_encode
               (opj_pi_iterator_t *pi,opj_cp_t *cp,OPJ_UINT32 tileno,OPJ_UINT32 pino,
               OPJ_UINT32 tpnum,OPJ_INT32 tppos,J2K_T2_MODE t2_mode)

{
  byte bVar1;
  uint uVar2;
  opj_tcp_t *poVar3;
  bool bVar4;
  bool bVar5;
  OPJ_BOOL OVar6;
  uint uVar7;
  char *prog;
  long lVar8;
  bool bVar9;
  uint uVar10;
  ushort uVar11;
  int pos;
  int iVar12;
  OPJ_UINT32 OVar13;
  OPJ_UINT32 OVar14;
  long lVar15;
  
  poVar3 = cp->tcps;
  prog = opj_j2k_convert_progression_order(poVar3[tileno].pocs[pino].prg);
  pi[pino].first = 1;
  pi[pino].poc.prg = poVar3[tileno].pocs[pino].prg;
  if ((*(byte *)((long)&cp->m_specific_param + 0x18) & 1) == 0) {
LAB_0012b865:
    pi[pino].poc.resno0 = poVar3[tileno].pocs[pino].resS;
    pi[pino].poc.resno1 = poVar3[tileno].pocs[pino].resE;
    pi[pino].poc.compno0 = poVar3[tileno].pocs[pino].compS;
    pi[pino].poc.compno1 = poVar3[tileno].pocs[pino].compE;
    pi[pino].poc.layno0 = poVar3[tileno].pocs[pino].layS;
    pi[pino].poc.layno1 = poVar3[tileno].pocs[pino].layE;
    pi[pino].poc.precno0 = poVar3[tileno].pocs[pino].prcS;
    pi[pino].poc.precno1 = poVar3[tileno].pocs[pino].prcE;
    pi[pino].poc.tx0 = poVar3[tileno].pocs[pino].txS;
    pi[pino].poc.ty0 = poVar3[tileno].pocs[pino].tyS;
    pi[pino].poc.tx1 = poVar3[tileno].pocs[pino].txE;
    pi[pino].poc.ty1 = poVar3[tileno].pocs[pino].tyE;
  }
  else {
    uVar7 = *(uint *)cp;
    uVar11 = (short)uVar7 - 3;
    if (3 < uVar11) {
      if ((uVar7 & 0xffff) < 0x400) {
        bVar9 = t2_mode == FINAL_PASS;
      }
      else {
        bVar9 = t2_mode == FINAL_PASS && 0x99b < (uVar7 & 0xffff);
      }
      if ((!bVar9 && 3 < uVar11) && (0x59b < (uVar7 - 0x400 & 0xffff))) goto LAB_0012b865;
    }
    if (tppos < 3) {
      lVar8 = (long)tppos;
      do {
        bVar1 = prog[lVar8 + 1];
        if (bVar1 < 0x50) {
          if (bVar1 == 0x43) {
            pi[pino].poc.compno0 = poVar3[tileno].pocs[pino].compS;
            pi[pino].poc.compno1 = poVar3[tileno].pocs[pino].compE;
          }
          else if (bVar1 == 0x4c) {
            pi[pino].poc.layno0 = poVar3[tileno].pocs[pino].layS;
            pi[pino].poc.layno1 = poVar3[tileno].pocs[pino].layE;
          }
        }
        else if (bVar1 == 0x50) {
          if ((uint)poVar3[tileno].pocs[pino].prg < 2) {
            pi[pino].poc.precno0 = poVar3[tileno].pocs[pino].prcS;
            pi[pino].poc.precno1 = poVar3[tileno].pocs[pino].prcE;
          }
          else {
            pi[pino].poc.tx0 = poVar3[tileno].pocs[pino].txS;
            pi[pino].poc.ty0 = poVar3[tileno].pocs[pino].tyS;
            pi[pino].poc.tx1 = poVar3[tileno].pocs[pino].txE;
            pi[pino].poc.ty1 = poVar3[tileno].pocs[pino].tyE;
          }
        }
        else if (bVar1 == 0x52) {
          pi[pino].poc.resno0 = poVar3[tileno].pocs[pino].resS;
          pi[pino].poc.resno1 = poVar3[tileno].pocs[pino].resE;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
    }
    if (tpnum == 0) {
      if (-1 < tppos) {
        lVar8 = (ulong)(uint)tppos + 1;
        do {
          bVar1 = prog[lVar8 + -1];
          if (bVar1 < 0x50) {
            if (bVar1 == 0x43) {
              OVar13 = poVar3[tileno].pocs[pino].compS;
              poVar3[tileno].pocs[pino].comp_t = OVar13;
              pi[pino].poc.compno0 = OVar13;
              pi[pino].poc.compno1 = OVar13 + 1;
              poVar3[tileno].pocs[pino].comp_t = OVar13 + 1;
            }
            else if (bVar1 == 0x4c) {
              OVar13 = poVar3[tileno].pocs[pino].layS;
              poVar3[tileno].pocs[pino].lay_t = OVar13;
              pi[pino].poc.layno0 = OVar13;
              pi[pino].poc.layno1 = OVar13 + 1;
              poVar3[tileno].pocs[pino].lay_t = OVar13 + 1;
            }
          }
          else if (bVar1 == 0x50) {
            if ((uint)poVar3[tileno].pocs[pino].prg < 2) {
              OVar13 = poVar3[tileno].pocs[pino].prcS;
              poVar3[tileno].pocs[pino].prc_t = OVar13;
              pi[pino].poc.precno0 = OVar13;
              pi[pino].poc.precno1 = OVar13 + 1;
              poVar3[tileno].pocs[pino].prc_t = OVar13 + 1;
            }
            else {
              uVar7 = poVar3[tileno].pocs[pino].txS;
              uVar10 = poVar3[tileno].pocs[pino].tyS;
              poVar3[tileno].pocs[pino].tx0_t = uVar7;
              poVar3[tileno].pocs[pino].ty0_t = uVar10;
              pi[pino].poc.tx0 = uVar7;
              uVar2 = poVar3[tileno].pocs[pino].dx;
              OVar13 = (uVar2 + uVar7) - uVar7 % uVar2;
              pi[pino].poc.tx1 = OVar13;
              pi[pino].poc.ty0 = uVar10;
              uVar7 = poVar3[tileno].pocs[pino].dy;
              OVar14 = (uVar7 + uVar10) - uVar10 % uVar7;
              pi[pino].poc.ty1 = OVar14;
              poVar3[tileno].pocs[pino].tx0_t = OVar13;
              poVar3[tileno].pocs[pino].ty0_t = OVar14;
            }
          }
          else if (bVar1 == 0x52) {
            OVar13 = poVar3[tileno].pocs[pino].resS;
            poVar3[tileno].pocs[pino].res_t = OVar13;
            pi[pino].poc.resno0 = OVar13;
            pi[pino].poc.resno1 = OVar13 + 1;
            poVar3[tileno].pocs[pino].res_t = OVar13 + 1;
          }
          lVar15 = lVar8 + -1;
          bVar9 = 0 < lVar8;
          lVar8 = lVar15;
        } while (lVar15 != 0 && bVar9);
      }
    }
    else if (-1 < tppos) {
      pos = tppos + -1;
      bVar9 = true;
      lVar8 = (ulong)(uint)tppos + 1;
      do {
        bVar1 = prog[lVar8 + -1];
        if (bVar1 < 0x50) {
          if (bVar1 == 0x43) {
            OVar13 = poVar3[tileno].pocs[pino].comp_t;
            pi[pino].poc.compno0 = OVar13 - 1;
            pi[pino].poc.compno1 = OVar13;
          }
          else if (bVar1 == 0x4c) {
            OVar13 = poVar3[tileno].pocs[pino].lay_t;
            pi[pino].poc.layno0 = OVar13 - 1;
            pi[pino].poc.layno1 = OVar13;
          }
        }
        else if (bVar1 == 0x50) {
          if ((uint)poVar3[tileno].pocs[pino].prg < 2) {
            OVar13 = poVar3[tileno].pocs[pino].prc_t;
            pi[pino].poc.precno0 = OVar13 - 1;
            pi[pino].poc.precno1 = OVar13;
          }
          else {
            uVar7 = poVar3[tileno].pocs[pino].dx;
            uVar10 = poVar3[tileno].pocs[pino].tx0_t;
            pi[pino].poc.tx0 = uVar10 - (uVar10 % uVar7 + uVar7);
            pi[pino].poc.tx1 = uVar10;
            uVar7 = poVar3[tileno].pocs[pino].dy;
            uVar10 = poVar3[tileno].pocs[pino].ty0_t;
            pi[pino].poc.ty0 = uVar10 - (uVar10 % uVar7 + uVar7);
            pi[pino].poc.ty1 = uVar10;
          }
        }
        else if (bVar1 == 0x52) {
          OVar13 = poVar3[tileno].pocs[pino].res_t;
          pi[pino].poc.resno0 = OVar13 - 1;
          pi[pino].poc.resno1 = OVar13;
        }
        bVar5 = false;
        bVar4 = false;
        if (bVar9) {
          bVar1 = prog[lVar8 + -1];
          bVar4 = bVar5;
          if (bVar1 < 0x50) {
            if (bVar1 == 0x43) {
              OVar13 = poVar3[tileno].pocs[pino].comp_t;
              if (OVar13 == poVar3[tileno].pocs[pino].compE) {
                OVar6 = opj_pi_check_next_level(pos,cp,tileno,pino,prog);
                if (OVar6 != 0) {
                  OVar13 = poVar3[tileno].pocs[pino].compS;
                  poVar3[tileno].pocs[pino].comp_t = OVar13;
                  pi[pino].poc.compno0 = OVar13;
                  pi[pino].poc.compno1 = OVar13 + 1;
                  poVar3[tileno].pocs[pino].comp_t = OVar13 + 1;
                  goto LAB_0012bc55;
                }
              }
              else {
                pi[pino].poc.compno0 = OVar13;
                pi[pino].poc.compno1 = OVar13 + 1;
                poVar3[tileno].pocs[pino].comp_t = OVar13 + 1;
              }
            }
            else if (bVar1 == 0x4c) {
              OVar13 = poVar3[tileno].pocs[pino].lay_t;
              if (OVar13 == poVar3[tileno].pocs[pino].layE) {
                OVar6 = opj_pi_check_next_level(pos,cp,tileno,pino,prog);
                bVar4 = false;
                if (OVar6 != 0) {
                  OVar13 = poVar3[tileno].pocs[pino].layS;
                  poVar3[tileno].pocs[pino].lay_t = OVar13;
                  pi[pino].poc.layno0 = OVar13;
                  pi[pino].poc.layno1 = OVar13 + 1;
                  poVar3[tileno].pocs[pino].lay_t = OVar13 + 1;
                  goto LAB_0012bc55;
                }
              }
              else {
                pi[pino].poc.layno0 = OVar13;
                pi[pino].poc.layno1 = OVar13 + 1;
                poVar3[tileno].pocs[pino].lay_t = OVar13 + 1;
                bVar4 = false;
              }
            }
            else {
LAB_0012bc55:
              bVar4 = true;
            }
          }
          else if (bVar1 == 0x50) {
            if ((uint)poVar3[tileno].pocs[pino].prg < 2) {
              OVar13 = poVar3[tileno].pocs[pino].prc_t;
              if (OVar13 == poVar3[tileno].pocs[pino].prcE) {
                OVar6 = opj_pi_check_next_level(pos,cp,tileno,pino,prog);
                if (OVar6 != 0) {
                  OVar13 = poVar3[tileno].pocs[pino].prcS;
                  poVar3[tileno].pocs[pino].prc_t = OVar13;
                  pi[pino].poc.precno0 = OVar13;
                  pi[pino].poc.precno1 = OVar13 + 1;
                  poVar3[tileno].pocs[pino].prc_t = OVar13 + 1;
                  goto LAB_0012bc55;
                }
              }
              else {
                pi[pino].poc.precno0 = OVar13;
                pi[pino].poc.precno1 = OVar13 + 1;
                poVar3[tileno].pocs[pino].prc_t = OVar13 + 1;
              }
              goto LAB_0012bc5b;
            }
            uVar7 = poVar3[tileno].pocs[pino].tx0_t;
            if (uVar7 < poVar3[tileno].pocs[pino].txE) {
              pi[pino].poc.tx0 = uVar7;
              uVar10 = poVar3[tileno].pocs[pino].dx;
              iVar12 = uVar10 + uVar7;
              bVar4 = false;
            }
            else {
              uVar7 = poVar3[tileno].pocs[pino].ty0_t;
              if (uVar7 < poVar3[tileno].pocs[pino].tyE) {
                pi[pino].poc.ty0 = uVar7;
                bVar4 = false;
LAB_0012bd2a:
                uVar10 = poVar3[tileno].pocs[pino].dy;
                OVar13 = (uVar10 + uVar7) - uVar7 % uVar10;
                pi[pino].poc.ty1 = OVar13;
                poVar3[tileno].pocs[pino].ty0_t = OVar13;
                bVar9 = true;
              }
              else {
                OVar6 = opj_pi_check_next_level(pos,cp,tileno,pino,prog);
                if (OVar6 != 0) {
                  uVar7 = poVar3[tileno].pocs[pino].tyS;
                  poVar3[tileno].pocs[pino].ty0_t = uVar7;
                  pi[pino].poc.ty0 = uVar7;
                  bVar4 = true;
                  goto LAB_0012bd2a;
                }
                bVar9 = false;
                bVar4 = false;
              }
              if (!bVar9) goto LAB_0012bc5b;
              uVar7 = poVar3[tileno].pocs[pino].txS;
              poVar3[tileno].pocs[pino].tx0_t = uVar7;
              pi[pino].poc.tx0 = uVar7;
              uVar10 = poVar3[tileno].pocs[pino].dx;
              iVar12 = uVar10 + uVar7;
            }
            OVar13 = iVar12 - uVar7 % uVar10;
            pi[pino].poc.tx1 = OVar13;
            poVar3[tileno].pocs[pino].tx0_t = OVar13;
          }
          else {
            if (bVar1 != 0x52) goto LAB_0012bc55;
            OVar13 = poVar3[tileno].pocs[pino].res_t;
            if (OVar13 == poVar3[tileno].pocs[pino].resE) {
              OVar6 = opj_pi_check_next_level(pos,cp,tileno,pino,prog);
              if (OVar6 != 0) {
                OVar13 = poVar3[tileno].pocs[pino].resS;
                poVar3[tileno].pocs[pino].res_t = OVar13;
                pi[pino].poc.resno0 = OVar13;
                pi[pino].poc.resno1 = OVar13 + 1;
                poVar3[tileno].pocs[pino].res_t = OVar13 + 1;
                goto LAB_0012bc55;
              }
            }
            else {
              pi[pino].poc.resno0 = OVar13;
              pi[pino].poc.resno1 = OVar13 + 1;
              poVar3[tileno].pocs[pino].res_t = OVar13 + 1;
            }
          }
        }
LAB_0012bc5b:
        bVar9 = bVar4;
        pos = pos + -1;
        lVar15 = lVar8 + -1;
        bVar4 = 0 < lVar8;
        lVar8 = lVar15;
      } while (lVar15 != 0 && bVar4);
    }
  }
  return;
}

Assistant:

void opj_pi_create_encode(opj_pi_iterator_t *pi,
                          opj_cp_t *cp,
                          OPJ_UINT32 tileno,
                          OPJ_UINT32 pino,
                          OPJ_UINT32 tpnum,
                          OPJ_INT32 tppos,
                          J2K_T2_MODE t2_mode)
{
    const OPJ_CHAR *prog;
    OPJ_INT32 i;
    OPJ_UINT32 incr_top = 1, resetX = 0;
    opj_tcp_t *tcps = &cp->tcps[tileno];
    opj_poc_t *tcp = &tcps->pocs[pino];

    prog = opj_j2k_convert_progression_order(tcp->prg);

    pi[pino].first = 1;
    pi[pino].poc.prg = tcp->prg;

    if (!(cp->m_specific_param.m_enc.m_tp_on && ((!OPJ_IS_CINEMA(cp->rsiz) &&
            !OPJ_IS_IMF(cp->rsiz) &&
            (t2_mode == FINAL_PASS)) || OPJ_IS_CINEMA(cp->rsiz) || OPJ_IS_IMF(cp->rsiz)))) {
        pi[pino].poc.resno0 = tcp->resS;
        pi[pino].poc.resno1 = tcp->resE;
        pi[pino].poc.compno0 = tcp->compS;
        pi[pino].poc.compno1 = tcp->compE;
        pi[pino].poc.layno0 = tcp->layS;
        pi[pino].poc.layno1 = tcp->layE;
        pi[pino].poc.precno0 = tcp->prcS;
        pi[pino].poc.precno1 = tcp->prcE;
        pi[pino].poc.tx0 = tcp->txS;
        pi[pino].poc.ty0 = tcp->tyS;
        pi[pino].poc.tx1 = tcp->txE;
        pi[pino].poc.ty1 = tcp->tyE;
    } else {
        for (i = tppos + 1; i < 4; i++) {
            switch (prog[i]) {
            case 'R':
                pi[pino].poc.resno0 = tcp->resS;
                pi[pino].poc.resno1 = tcp->resE;
                break;
            case 'C':
                pi[pino].poc.compno0 = tcp->compS;
                pi[pino].poc.compno1 = tcp->compE;
                break;
            case 'L':
                pi[pino].poc.layno0 = tcp->layS;
                pi[pino].poc.layno1 = tcp->layE;
                break;
            case 'P':
                switch (tcp->prg) {
                case OPJ_LRCP:
                case OPJ_RLCP:
                    pi[pino].poc.precno0 = tcp->prcS;
                    pi[pino].poc.precno1 = tcp->prcE;
                    break;
                default:
                    pi[pino].poc.tx0 = tcp->txS;
                    pi[pino].poc.ty0 = tcp->tyS;
                    pi[pino].poc.tx1 = tcp->txE;
                    pi[pino].poc.ty1 = tcp->tyE;
                    break;
                }
                break;
            }
        }

        if (tpnum == 0) {
            for (i = tppos; i >= 0; i--) {
                switch (prog[i]) {
                case 'C':
                    tcp->comp_t = tcp->compS;
                    pi[pino].poc.compno0 = tcp->comp_t;
                    pi[pino].poc.compno1 = tcp->comp_t + 1;
                    tcp->comp_t += 1;
                    break;
                case 'R':
                    tcp->res_t = tcp->resS;
                    pi[pino].poc.resno0 = tcp->res_t;
                    pi[pino].poc.resno1 = tcp->res_t + 1;
                    tcp->res_t += 1;
                    break;
                case 'L':
                    tcp->lay_t = tcp->layS;
                    pi[pino].poc.layno0 = tcp->lay_t;
                    pi[pino].poc.layno1 = tcp->lay_t + 1;
                    tcp->lay_t += 1;
                    break;
                case 'P':
                    switch (tcp->prg) {
                    case OPJ_LRCP:
                    case OPJ_RLCP:
                        tcp->prc_t = tcp->prcS;
                        pi[pino].poc.precno0 = tcp->prc_t;
                        pi[pino].poc.precno1 = tcp->prc_t + 1;
                        tcp->prc_t += 1;
                        break;
                    default:
                        tcp->tx0_t = tcp->txS;
                        tcp->ty0_t = tcp->tyS;
                        pi[pino].poc.tx0 = tcp->tx0_t;
                        pi[pino].poc.tx1 = tcp->tx0_t + tcp->dx - (tcp->tx0_t % tcp->dx);
                        pi[pino].poc.ty0 = tcp->ty0_t;
                        pi[pino].poc.ty1 = tcp->ty0_t + tcp->dy - (tcp->ty0_t % tcp->dy);
                        tcp->tx0_t = (OPJ_UINT32)pi[pino].poc.tx1;
                        tcp->ty0_t = (OPJ_UINT32)pi[pino].poc.ty1;
                        break;
                    }
                    break;
                }
            }
            incr_top = 1;
        } else {
            for (i = tppos; i >= 0; i--) {
                switch (prog[i]) {
                case 'C':
                    pi[pino].poc.compno0 = tcp->comp_t - 1;
                    pi[pino].poc.compno1 = tcp->comp_t;
                    break;
                case 'R':
                    pi[pino].poc.resno0 = tcp->res_t - 1;
                    pi[pino].poc.resno1 = tcp->res_t;
                    break;
                case 'L':
                    pi[pino].poc.layno0 = tcp->lay_t - 1;
                    pi[pino].poc.layno1 = tcp->lay_t;
                    break;
                case 'P':
                    switch (tcp->prg) {
                    case OPJ_LRCP:
                    case OPJ_RLCP:
                        pi[pino].poc.precno0 = tcp->prc_t - 1;
                        pi[pino].poc.precno1 = tcp->prc_t;
                        break;
                    default:
                        pi[pino].poc.tx0 = tcp->tx0_t - tcp->dx - (tcp->tx0_t % tcp->dx);
                        pi[pino].poc.tx1 = tcp->tx0_t ;
                        pi[pino].poc.ty0 = tcp->ty0_t - tcp->dy - (tcp->ty0_t % tcp->dy);
                        pi[pino].poc.ty1 = tcp->ty0_t ;
                        break;
                    }
                    break;
                }
                if (incr_top == 1) {
                    switch (prog[i]) {
                    case 'R':
                        if (tcp->res_t == tcp->resE) {
                            if (opj_pi_check_next_level(i - 1, cp, tileno, pino, prog)) {
                                tcp->res_t = tcp->resS;
                                pi[pino].poc.resno0 = tcp->res_t;
                                pi[pino].poc.resno1 = tcp->res_t + 1;
                                tcp->res_t += 1;
                                incr_top = 1;
                            } else {
                                incr_top = 0;
                            }
                        } else {
                            pi[pino].poc.resno0 = tcp->res_t;
                            pi[pino].poc.resno1 = tcp->res_t + 1;
                            tcp->res_t += 1;
                            incr_top = 0;
                        }
                        break;
                    case 'C':
                        if (tcp->comp_t == tcp->compE) {
                            if (opj_pi_check_next_level(i - 1, cp, tileno, pino, prog)) {
                                tcp->comp_t = tcp->compS;
                                pi[pino].poc.compno0 = tcp->comp_t;
                                pi[pino].poc.compno1 = tcp->comp_t + 1;
                                tcp->comp_t += 1;
                                incr_top = 1;
                            } else {
                                incr_top = 0;
                            }
                        } else {
                            pi[pino].poc.compno0 = tcp->comp_t;
                            pi[pino].poc.compno1 = tcp->comp_t + 1;
                            tcp->comp_t += 1;
                            incr_top = 0;
                        }
                        break;
                    case 'L':
                        if (tcp->lay_t == tcp->layE) {
                            if (opj_pi_check_next_level(i - 1, cp, tileno, pino, prog)) {
                                tcp->lay_t = tcp->layS;
                                pi[pino].poc.layno0 = tcp->lay_t;
                                pi[pino].poc.layno1 = tcp->lay_t + 1;
                                tcp->lay_t += 1;
                                incr_top = 1;
                            } else {
                                incr_top = 0;
                            }
                        } else {
                            pi[pino].poc.layno0 = tcp->lay_t;
                            pi[pino].poc.layno1 = tcp->lay_t + 1;
                            tcp->lay_t += 1;
                            incr_top = 0;
                        }
                        break;
                    case 'P':
                        switch (tcp->prg) {
                        case OPJ_LRCP:
                        case OPJ_RLCP:
                            if (tcp->prc_t == tcp->prcE) {
                                if (opj_pi_check_next_level(i - 1, cp, tileno, pino, prog)) {
                                    tcp->prc_t = tcp->prcS;
                                    pi[pino].poc.precno0 = tcp->prc_t;
                                    pi[pino].poc.precno1 = tcp->prc_t + 1;
                                    tcp->prc_t += 1;
                                    incr_top = 1;
                                } else {
                                    incr_top = 0;
                                }
                            } else {
                                pi[pino].poc.precno0 = tcp->prc_t;
                                pi[pino].poc.precno1 = tcp->prc_t + 1;
                                tcp->prc_t += 1;
                                incr_top = 0;
                            }
                            break;
                        default:
                            if (tcp->tx0_t >= tcp->txE) {
                                if (tcp->ty0_t >= tcp->tyE) {
                                    if (opj_pi_check_next_level(i - 1, cp, tileno, pino, prog)) {
                                        tcp->ty0_t = tcp->tyS;
                                        pi[pino].poc.ty0 = tcp->ty0_t;
                                        pi[pino].poc.ty1 = tcp->ty0_t + tcp->dy - (tcp->ty0_t % tcp->dy);
                                        tcp->ty0_t = (OPJ_UINT32)pi[pino].poc.ty1;
                                        incr_top = 1;
                                        resetX = 1;
                                    } else {
                                        incr_top = 0;
                                        resetX = 0;
                                    }
                                } else {
                                    pi[pino].poc.ty0 = tcp->ty0_t;
                                    pi[pino].poc.ty1 = tcp->ty0_t + tcp->dy - (tcp->ty0_t % tcp->dy);
                                    tcp->ty0_t = (OPJ_UINT32)pi[pino].poc.ty1;
                                    incr_top = 0;
                                    resetX = 1;
                                }
                                if (resetX == 1) {
                                    tcp->tx0_t = tcp->txS;
                                    pi[pino].poc.tx0 = tcp->tx0_t;
                                    pi[pino].poc.tx1 = tcp->tx0_t + tcp->dx - (tcp->tx0_t % tcp->dx);
                                    tcp->tx0_t = (OPJ_UINT32)pi[pino].poc.tx1;
                                }
                            } else {
                                pi[pino].poc.tx0 = tcp->tx0_t;
                                pi[pino].poc.tx1 = tcp->tx0_t + tcp->dx - (tcp->tx0_t % tcp->dx);
                                tcp->tx0_t = (OPJ_UINT32)pi[pino].poc.tx1;
                                incr_top = 0;
                            }
                            break;
                        }
                        break;
                    }
                }
            }
        }
    }
}